

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkStencilOpState *
Diligent::StencilOpDescToVkStencilOpState
          (VkStencilOpState *__return_storage_ptr__,StencilOpDesc *desc,Uint8 StencilReadMask,
          Uint8 StencilWriteMask)

{
  VkStencilOp VVar1;
  VkCompareOp VVar2;
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  
  __return_storage_ptr__->compareOp = VK_COMPARE_OP_NEVER;
  __return_storage_ptr__->compareMask = 0;
  __return_storage_ptr__->writeMask = 0;
  __return_storage_ptr__->reference = 0;
  __return_storage_ptr__->failOp = VK_STENCIL_OP_KEEP;
  __return_storage_ptr__->passOp = VK_STENCIL_OP_KEEP;
  __return_storage_ptr__->depthFailOp = VK_STENCIL_OP_KEEP;
  __return_storage_ptr__->compareOp = VK_COMPARE_OP_NEVER;
  VVar1 = StencilOpToVkStencilOp(desc->StencilFailOp);
  __return_storage_ptr__->failOp = VVar1;
  VVar1 = StencilOpToVkStencilOp(desc->StencilPassOp);
  __return_storage_ptr__->passOp = VVar1;
  VVar1 = StencilOpToVkStencilOp(desc->StencilDepthFailOp);
  __return_storage_ptr__->depthFailOp = VVar1;
  VVar2 = ComparisonFuncToVkCompareOp(desc->StencilFunc);
  __return_storage_ptr__->compareOp = VVar2;
  __return_storage_ptr__->compareMask = CONCAT31(in_register_00000011,StencilReadMask);
  __return_storage_ptr__->writeMask = CONCAT31(in_register_00000009,StencilWriteMask);
  __return_storage_ptr__->reference = 0;
  return __return_storage_ptr__;
}

Assistant:

VkStencilOpState StencilOpDescToVkStencilOpState(const StencilOpDesc& desc, Uint8 StencilReadMask, Uint8 StencilWriteMask)
{
    // Stencil state (25.9)
    VkStencilOpState StencilState = {};
    StencilState.failOp           = StencilOpToVkStencilOp(desc.StencilFailOp);
    StencilState.passOp           = StencilOpToVkStencilOp(desc.StencilPassOp);
    StencilState.depthFailOp      = StencilOpToVkStencilOp(desc.StencilDepthFailOp);
    StencilState.compareOp        = ComparisonFuncToVkCompareOp(desc.StencilFunc);

    // The s least significant bits of compareMask,  where s is the number of bits in the stencil framebuffer attachment,
    // are bitwise ANDed with both the reference and the stored stencil value, and the resulting masked values are those
    // that participate in the comparison controlled by compareOp
    StencilState.compareMask = StencilReadMask;

    // The least significant s bits of writeMask, where s is the number of bits in the stencil framebuffer
    // attachment, specify an integer mask. Where a 1 appears in this mask, the corresponding bit in the stencil
    // value in the depth / stencil attachment is written; where a 0 appears, the bit is not written
    StencilState.writeMask = StencilWriteMask;

    StencilState.reference = 0; // Set dynamically

    return StencilState;
}